

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O0

void mjs::anon_unknown_33::define_own_property_checked
               (gc_heap_ptr<mjs::global_object> *global,object_ptr *o,string *p,value *desc)

{
  define_own_property_result dVar1;
  global_object *pgVar2;
  wostream *pwVar3;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  native_error_exception *this;
  wstring local_248 [32];
  wstring_view local_228;
  wstring local_218;
  wstring_view local_1f8;
  wstring_view local_1e8;
  wstring_view local_1d8;
  wostringstream local_1c8 [8];
  wostringstream woss;
  undefined1 local_40 [28];
  define_own_property_result res;
  value *desc_local;
  string *p_local;
  object_ptr *o_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  unique0x10000296 = desc;
  desc_local = (value *)p;
  p_local = (string *)o;
  o_local = (object_ptr *)global;
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  global_object::validate_object((global_object *)local_40,(value *)pgVar2);
  dVar1 = define_own_property(global,o,p,(object_ptr *)local_40);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_40);
  if (dVar1 == ok) {
    return;
  }
  local_40._20_4_ = dVar1;
  std::__cxx11::wostringstream::wostringstream(local_1c8);
  if (local_40._20_4_ == cannot_redefine) {
    pwVar3 = std::operator<<((wostream *)local_1c8,"cannot redefine property: ");
    local_1d8 = string::view((string *)desc_local);
    std::operator<<(pwVar3,local_1d8);
  }
  else {
    if (local_40._20_4_ != not_extensible) {
      __assert_fail("res == define_own_property_result::not_extensible",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                    ,0xea,
                    "void mjs::(anonymous namespace)::define_own_property_checked(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const value &)"
                   );
    }
    pwVar3 = std::operator<<((wostream *)local_1c8,"cannot define property: ");
    local_1e8 = string::view((string *)desc_local);
    pbVar4 = std::operator<<(pwVar3,local_1e8);
    std::operator<<(pbVar4,", object is not extensible");
  }
  this = (native_error_exception *)__cxa_allocate_exception(0x58);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->((gc_heap_ptr<mjs::global_object> *)o_local);
  global_object::stack_trace_abi_cxx11_(&local_218,pgVar2);
  local_1f8 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_218);
  std::__cxx11::wostringstream::str();
  local_228 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_248);
  native_error_exception::native_error_exception(this,type,&local_1f8,&local_228);
  __cxa_throw(this,&native_error_exception::typeinfo,native_error_exception::~native_error_exception
             );
}

Assistant:

void define_own_property_checked(const gc_heap_ptr<global_object>& global, const object_ptr& o, const string& p, const value& desc) {
    const auto res = define_own_property(global, o, p, global->validate_object(desc));
    if (res == define_own_property_result::ok) {
        return;
    }

    std::wostringstream woss;
    if (res == define_own_property_result::cannot_redefine) {
        woss << "cannot redefine property: " << p.view();
    } else {
        assert(res == define_own_property_result::not_extensible);
        woss << "cannot define property: " << p.view() << ", object is not extensible";
    }
    throw native_error_exception{native_error_type::type, global->stack_trace(), woss.str()};
}